

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O0

void MinorRoot(GCObjectVisitor *v)

{
  bool bVar1;
  reference ppTVar2;
  reference ppCVar3;
  reference ppSVar4;
  undefined8 in_RDI;
  String *s;
  iterator __end1_2;
  iterator __begin1_2;
  deque<luna::String_*,_std::allocator<luna::String_*>_> *__range1_2;
  Closure *c;
  iterator __end1_1;
  iterator __begin1_1;
  deque<luna::Closure_*,_std::allocator<luna::Closure_*>_> *__range1_1;
  Table *t;
  iterator __end1;
  iterator __begin1;
  deque<luna::Table_*,_std::allocator<luna::Table_*>_> *__range1;
  String *in_stack_ffffffffffffff08;
  _Self *in_stack_ffffffffffffff10;
  _Deque_iterator<luna::String_*,_luna::String_*&,_luna::String_**> local_d0;
  deque<luna::String_*,_std::allocator<luna::String_*>_> *local_b0;
  Closure *local_a8;
  _Deque_iterator<luna::Closure_*,_luna::Closure_*&,_luna::Closure_**> local_80;
  deque<luna::Closure_*,_std::allocator<luna::Closure_*>_> *local_60;
  Table *local_58;
  _Deque_iterator<luna::Table_*,_luna::Table_*&,_luna::Table_**> local_30;
  deque<luna::Table_*,_std::allocator<luna::Table_*>_> *local_10;
  undefined8 local_8;
  
  local_10 = &g_scopeTable;
  local_8 = in_RDI;
  std::deque<luna::Table_*,_std::allocator<luna::Table_*>_>::begin
            ((deque<luna::Table_*,_std::allocator<luna::Table_*>_> *)in_stack_ffffffffffffff08);
  std::deque<luna::Table_*,_std::allocator<luna::Table_*>_>::end
            ((deque<luna::Table_*,_std::allocator<luna::Table_*>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff10,(_Self *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    ppTVar2 = std::_Deque_iterator<luna::Table_*,_luna::Table_*&,_luna::Table_**>::operator*
                        (&local_30);
    local_58 = *ppTVar2;
    (*(local_58->super_GCObject)._vptr_GCObject[2])(local_58,local_8);
    std::_Deque_iterator<luna::Table_*,_luna::Table_*&,_luna::Table_**>::operator++
              ((_Deque_iterator<luna::Table_*,_luna::Table_*&,_luna::Table_**> *)
               in_stack_ffffffffffffff10);
  }
  local_60 = &g_scopeClosure;
  std::deque<luna::Closure_*,_std::allocator<luna::Closure_*>_>::begin
            ((deque<luna::Closure_*,_std::allocator<luna::Closure_*>_> *)in_stack_ffffffffffffff08);
  std::deque<luna::Closure_*,_std::allocator<luna::Closure_*>_>::end
            ((deque<luna::Closure_*,_std::allocator<luna::Closure_*>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff10,(_Self *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    ppCVar3 = std::_Deque_iterator<luna::Closure_*,_luna::Closure_*&,_luna::Closure_**>::operator*
                        (&local_80);
    local_a8 = *ppCVar3;
    (*(local_a8->super_GCObject)._vptr_GCObject[2])(local_a8,local_8);
    std::_Deque_iterator<luna::Closure_*,_luna::Closure_*&,_luna::Closure_**>::operator++
              ((_Deque_iterator<luna::Closure_*,_luna::Closure_*&,_luna::Closure_**> *)
               in_stack_ffffffffffffff10);
  }
  local_b0 = &g_scopeString;
  std::deque<luna::String_*,_std::allocator<luna::String_*>_>::begin
            ((deque<luna::String_*,_std::allocator<luna::String_*>_> *)in_stack_ffffffffffffff08);
  std::deque<luna::String_*,_std::allocator<luna::String_*>_>::end
            ((deque<luna::String_*,_std::allocator<luna::String_*>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff10,(_Self *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    ppSVar4 = std::_Deque_iterator<luna::String_*,_luna::String_*&,_luna::String_**>::operator*
                        (&local_d0);
    in_stack_ffffffffffffff08 = *ppSVar4;
    (*(in_stack_ffffffffffffff08->super_GCObject)._vptr_GCObject[2])
              (in_stack_ffffffffffffff08,local_8);
    std::_Deque_iterator<luna::String_*,_luna::String_*&,_luna::String_**>::operator++
              (in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void MinorRoot(luna::GCObjectVisitor *v)
{
    for (auto t : g_scopeTable)
        t->Accept(v);
    for (auto c : g_scopeClosure)
        c->Accept(v);
    for (auto s : g_scopeString)
        s->Accept(v);
}